

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

result<long,_toml::error_info> *
toml::read_bin_int<long>
          (result<long,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src)

{
  long lVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  source_location local_140;
  error_info local_c8;
  error_info local_70;
  
  lVar4 = 1;
  lVar1 = 0;
  for (sVar2 = str->_M_string_length; sVar2 != 0; sVar2 = sVar2 - 1) {
    lVar5 = 0;
    if ((str->_M_dataplus)._M_p[sVar2 - 1] == '1') {
      lVar5 = lVar4;
    }
    lVar1 = lVar1 + lVar5;
    lVar5 = lVar4 * 2;
    lVar3 = 0;
    if (lVar4 < 0x4000000000000000) {
      lVar3 = lVar5;
    }
    lVar4 = lVar3;
    if (sVar2 == 1) {
      lVar4 = lVar5;
    }
  }
  if (lVar4 == 0) {
    CLI::std::__cxx11::to_string(&local_160,0x3f);
    std::operator+(&local_180,"toml::parse_bin_integer: too large integer: current max value = 2^",
                   &local_160);
    source_location::source_location(&local_140,src);
    CLI::std::__cxx11::to_string(&local_1c0,0x3f);
    std::operator+(&local_1a0,"must be < 2^",&local_1c0);
    make_error_info<>(&local_c8,(string *)&local_180,&local_140,(string *)&local_1a0);
    err<toml::error_info>((failure<toml::error_info> *)&local_70,&local_c8);
    result<long,_toml::error_info>::result(__return_storage_ptr__,(failure_type *)&local_70);
    error_info::~error_info(&local_70);
    error_info::~error_info(&local_c8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    source_location::~source_location(&local_140);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
  }
  else {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = lVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_bin_int(const std::string& str, const source_location src)
{
    constexpr auto is_bounded =  std::numeric_limits<T>::is_bounded;
    constexpr auto max_digits =  std::numeric_limits<T>::digits;
    const auto max_value  = (std::numeric_limits<T>::max)();

    T val{0};
    T base{1};
    for(auto i = str.rbegin(); i != str.rend(); ++i)
    {
        const auto c = *i;
        if(c == '1')
        {
            val += base;
            // prevent `base` from overflow
            if(is_bounded && max_value / 2 < base && std::next(i) != str.rend())
            {
                base = 0;
            }
            else
            {
                base *= 2;
            }
        }
        else
        {
            assert(c == '0');

            if(is_bounded && max_value / 2 < base && std::next(i) != str.rend())
            {
                base = 0;
            }
            else
            {
                base *= 2;
            }
        }
    }
    if(base == 0)
    {
        return err(make_error_info("toml::parse_bin_integer: "
            "too large integer: current max value = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}